

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall capnp::compiler::Compiler::Node::Node(Node *this,CompiledModule *module)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  ListReader *pLVar3;
  int iVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  undefined4 extraout_var;
  long lVar7;
  uint32_t uVar8;
  size_t extraout_RDX;
  Which WVar9;
  CapTableReader *pCVar10;
  CapTableReader *pCVar11;
  StringPtr declName;
  Reader RVar12;
  Reader name;
  ListReader local_80;
  PointerReader local_50;
  
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_resolve_00701138;
  this->module = module;
  (this->parent).ptr = (Node *)0x0;
  capnp::_::OrphanBuilder::asStructReader
            ((StructReader *)&local_80,&(module->content).builder,(StructSize)0x10000);
  iVar4 = 0x7fffffff;
  if (local_80.structPointerCount == 0) {
    local_50.capTable = (CapTableReader *)0x0;
    local_50.pointer = (WirePointer *)0x0;
    local_50.segment = (SegmentReader *)0x0;
    local_50.nestingLimit = 0x7fffffff;
  }
  else {
    local_50.pointer = (WirePointer *)CONCAT44(local_80.step,local_80.elementCount);
    local_50.capTable = local_80.capTable;
    local_50.segment = local_80.segment;
    local_50.nestingLimit = local_80.nestingLimit;
  }
  pCVar10 = (CapTableReader *)0x0;
  capnp::_::PointerReader::getStruct(&(this->declaration)._reader,&local_50,(word *)0x0);
  local_50.pointer = (WirePointer *)0x0;
  local_50.segment = (SegmentReader *)0x0;
  if ((this->declaration)._reader.pointerCount != 0) {
    local_50.segment = (this->declaration)._reader.segment;
    pCVar10 = (this->declaration)._reader.capTable;
    local_50.pointer = (this->declaration)._reader.pointers;
    iVar4 = (this->declaration)._reader.nestingLimit;
  }
  pCVar11 = (CapTableReader *)0x0;
  local_50.capTable = pCVar10;
  local_50.nestingLimit = iVar4;
  capnp::_::PointerReader::getStruct((StructReader *)&local_80,&local_50,(word *)0x0);
  if (local_80.structPointerCount == 0) {
    local_50.nestingLimit = 0x7fffffff;
    local_50.pointer = (WirePointer *)0x0;
    local_50.segment = (SegmentReader *)0x0;
  }
  else {
    local_50.pointer = (WirePointer *)CONCAT44(local_80.step,local_80.elementCount);
    local_50.segment = local_80.segment;
    pCVar11 = local_80.capTable;
    local_50.nestingLimit = local_80.nestingLimit;
  }
  WVar9 = FILE;
  local_50.capTable = pCVar11;
  declName.content =
       (ArrayPtr<const_char>)capnp::_::PointerReader::getBlob<capnp::Text>(&local_50,(void *)0x0,0);
  uVar6 = generateId(0,declName,(Reader)(this->declaration)._reader);
  this->id = uVar6;
  iVar4 = (*(module->parserModule->super_ErrorReporter)._vptr_ErrorReporter[3])();
  (this->displayName).content.ptr = (char *)CONCAT44(extraout_var,iVar4);
  (this->displayName).content.size_ = extraout_RDX;
  if (0x1f < (this->declaration)._reader.dataSize) {
    WVar9 = *(Which *)((long)(this->declaration)._reader.data + 2);
  }
  this->kind = WVar9;
  iVar4 = 0x7fffffff;
  pCVar10 = (CapTableReader *)0x0;
  if ((this->declaration)._reader.pointerCount < 8) {
    local_50.capTable = (CapTableReader *)0x0;
    local_50.pointer = (WirePointer *)0x0;
    local_50.segment = (SegmentReader *)0x0;
    local_50.nestingLimit = 0x7fffffff;
  }
  else {
    local_50.segment = (this->declaration)._reader.segment;
    local_50.capTable = (this->declaration)._reader.capTable;
    local_50.pointer = (this->declaration)._reader.pointers + 7;
    local_50.nestingLimit = (this->declaration)._reader.nestingLimit;
  }
  capnp::_::PointerReader::getList(&local_80,&local_50,INLINE_COMPOSITE,(word *)0x0);
  this->genericParamCount = local_80.elementCount;
  this->isBuiltin = false;
  (this->guardedContent).state = STUB;
  p_Var1 = &(this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->guardedContent).orderedNestedNodes.builder.ptr = (Node **)0x0;
  (this->guardedContent).orderedNestedNodes.builder.pos =
       (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
  (this->guardedContent).orderedNestedNodes.builder.endPtr = (Node **)0x0;
  (this->guardedContent).orderedNestedNodes.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  p_Var1 = &(this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->guardedContent).bootstrapSchema.ptr.isSet = false;
  (this->guardedContent).finalSchema.ptr.isSet = false;
  (this->loadedFinalSchema).ptr.isSet = false;
  (this->guardedContent).auxSchemas.ptr = (Reader *)0x0;
  (this->guardedContent).auxSchemas.size_ = 0;
  (this->guardedContent).auxSchemas.disposer = (ArrayDisposer *)0x0;
  (this->guardedContent).sourceInfo.ptr = (Reader *)0x0;
  (this->guardedContent).sourceInfo.size_ = 0;
  (this->guardedContent).sourceInfo.disposer = (ArrayDisposer *)0x0;
  this->inGetContent = false;
  local_50.pointer = (WirePointer *)0x0;
  local_50.segment = (SegmentReader *)0x0;
  if ((this->declaration)._reader.pointerCount != 0) {
    local_50.segment = (this->declaration)._reader.segment;
    pCVar10 = (this->declaration)._reader.capTable;
    local_50.pointer = (this->declaration)._reader.pointers;
    iVar4 = (this->declaration)._reader.nestingLimit;
  }
  local_50.capTable = pCVar10;
  local_50.nestingLimit = iVar4;
  capnp::_::PointerReader::getStruct((StructReader *)&local_80,&local_50,(word *)0x0);
  if (local_80.structPointerCount == 0) {
    local_80.nestingLimit = 0x7fffffff;
    local_80.capTable = (CapTableReader *)0x0;
    local_50.pointer = (WirePointer *)0x0;
    local_80.segment = (SegmentReader *)0x0;
  }
  else {
    local_50.pointer = (WirePointer *)CONCAT44(local_80.step,local_80.elementCount);
  }
  local_50.segment = local_80.segment;
  local_50.capTable = local_80.capTable;
  local_50.nestingLimit = local_80.nestingLimit;
  RVar12 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_50,(void *)0x0,0);
  if (RVar12.super_StringPtr.content.size_ == 1) {
    uVar2 = (this->declaration)._reader.dataSize;
    uVar5 = 0;
    uVar8 = 0;
    if (0x3f < uVar2) {
      uVar8 = *(uint32_t *)((long)(this->declaration)._reader.data + 4);
    }
    this->startByte = uVar8;
    if (uVar2 < 0x60) goto LAB_003ecf6e;
    pLVar3 = (ListReader *)&(this->declaration)._reader;
    lVar7 = 8;
  }
  else {
    uVar5 = 0;
    uVar8 = 0;
    if (0x1f < local_80.structDataSize) {
      uVar8 = *(uint32_t *)local_80.ptr;
    }
    this->startByte = uVar8;
    if (local_80.structDataSize < 0x40) goto LAB_003ecf6e;
    lVar7 = 4;
    pLVar3 = &local_80;
  }
  uVar5 = *(uint32_t *)(pLVar3->ptr + lVar7);
LAB_003ecf6e:
  this->endByte = uVar5;
  uVar6 = Impl::addNode(module->compiler,this->id,this);
  this->id = uVar6;
  return;
}

Assistant:

Compiler::Node::Node(CompiledModule& module)
    : module(&module),
      parent(kj::none),
      declaration(module.getParsedFile().getRoot()),
      id(generateId(0, declaration.getName().getValue(), declaration.getId())),
      displayName(module.getSourceName()),
      kind(declaration.which()),
      genericParamCount(declaration.getParameters().size()),
      isBuiltin(false) {
  auto name = declaration.getName();
  if (name.getValue().size() > 0) {
    startByte = name.getStartByte();
    endByte = name.getEndByte();
  } else {
    startByte = declaration.getStartByte();
    endByte = declaration.getEndByte();
  }

  id = module.getCompiler().addNode(id, *this);
}